

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O0

bool __thiscall
booster::aio::basic_socket::get_option(basic_socket *this,boolean_option_type opt,error_code *e)

{
  int iVar1;
  native_type nVar2;
  undefined8 *in_RDX;
  int in_ESI;
  basic_io_device *in_RDI;
  error_code eVar3;
  int res;
  int *ptr;
  socklen_t len;
  int value;
  undefined4 uStack_44;
  int local_34;
  socklen_t local_28;
  int local_24;
  undefined8 *local_20;
  bool local_1;
  
  local_24 = 0;
  local_28 = 4;
  local_34 = 0;
  local_20 = in_RDX;
  if (in_ESI == 0) {
    nVar2 = basic_io_device::native(in_RDI);
    local_34 = getsockopt(nVar2,6,1,&local_24,&local_28);
  }
  else if (in_ESI == 1) {
    nVar2 = basic_io_device::native(in_RDI);
    local_34 = getsockopt(nVar2,1,9,&local_24,&local_28);
  }
  else if (in_ESI == 2) {
    nVar2 = basic_io_device::native(in_RDI);
    local_34 = getsockopt(nVar2,1,2,&local_24,&local_28);
  }
  iVar1 = local_24;
  if (-1 >= local_34) {
    eVar3 = socket_details::geterror();
    *local_20 = CONCAT44(uStack_44,eVar3._M_value);
    local_20[1] = eVar3._M_cat;
  }
  local_1 = -1 < local_34 && iVar1 != 0;
  return local_1;
}

Assistant:

bool basic_socket::get_option(boolean_option_type opt,system::error_code &e)
{
	int value = 0;
	socklen_t len = sizeof(value);
	#ifdef BOOSTER_WIN32
	char *ptr = reinterpret_cast<char *>(&value);
	#else
	int *ptr = &value;
	#endif
	int res = 0;
	switch(opt) {
	case tcp_no_delay:
		res=::getsockopt(native(),IPPROTO_TCP,TCP_NODELAY,ptr,&len);
		break;
	case keep_alive:
		res=::getsockopt(native(),SOL_SOCKET,SO_KEEPALIVE,ptr,&len);
		break;
	case reuse_address:
		res=::getsockopt(native(),SOL_SOCKET,SO_REUSEADDR,ptr,&len);
		break;
	default:
		;
	}
	if(res < 0) {
		e=geterror();
		return false;
	}
	return value!=0;
}